

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O1

void duckdb::ListHasAllFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong *puVar5;
  data_ptr_t pdVar6;
  __buckets_ptr pp_Var7;
  sel_t *psVar8;
  data_ptr_t pdVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar10;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  SelectionVector *pSVar13;
  bool bVar14;
  int iVar15;
  BoundFunctionExpression *pBVar16;
  reference vec;
  reference vec_00;
  LogicalType *pLVar17;
  idx_t iVar18;
  idx_t iVar19;
  Vector *this_00;
  Vector *this_01;
  iterator iVar20;
  idx_t iVar21;
  TemplatedValidityData<unsigned_long> *pTVar22;
  idx_t iVar23;
  uint64_t idx_6;
  uint64_t idx_1;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  unsigned_long uVar27;
  ValidityMask *this_02;
  uint64_t idx_2;
  ulong uVar28;
  ulong uVar29;
  uint64_t idx;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  uint64_t idx_12;
  uint64_t idx_10;
  ulong uVar34;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat probe_format;
  UnifiedVectorFormat build_format;
  string_set_t set;
  Vector l_sortkey_vec;
  Vector r_sortkey_vec;
  ulong local_2e8;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2c0;
  UnifiedVectorFormat local_2b8;
  UnifiedVectorFormat local_270;
  UnifiedVectorFormat local_228;
  ulong local_1e0;
  ulong local_1d8;
  idx_t local_1d0;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c8;
  LogicalType local_190;
  LogicalType local_178;
  LogicalType local_160;
  UnifiedVectorFormat local_148;
  Vector local_100;
  Vector local_98;
  
  pBVar16 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  iVar15 = ::std::__cxx11::string::compare
                     ((char *)&(pBVar16->function).super_BaseScalarFunction.super_SimpleFunction.
                               super_Function.name);
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,(ulong)(iVar15 == 0));
  vec_00 = vector<duckdb::Vector,_true>::operator[](&args->data,(ulong)(iVar15 != 0));
  pLVar17 = ListType::GetChildType(&vec->type);
  LogicalType::LogicalType((LogicalType *)&local_100,SQLNULL);
  bVar14 = LogicalType::operator==(pLVar17,(LogicalType *)&local_100);
  if (bVar14) {
    pLVar17 = ListType::GetChildType(&vec_00->type);
    LogicalType::LogicalType(&local_160,SQLNULL);
    bVar14 = LogicalType::operator==(pLVar17,&local_160);
    LogicalType::~LogicalType(&local_160);
  }
  else {
    bVar14 = false;
  }
  LogicalType::~LogicalType((LogicalType *)&local_100);
  if (bVar14 != false) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    *result->data = '\x01';
    return;
  }
  iVar18 = ListVector::GetListSize(vec);
  iVar19 = ListVector::GetListSize(vec_00);
  this_00 = ListVector::GetEntry(vec);
  this_01 = ListVector::GetEntry(vec_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_228);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_270);
  Vector::ToUnifiedFormat(this_00,iVar18,&local_228);
  Vector::ToUnifiedFormat(this_01,iVar19,&local_270);
  LogicalType::LogicalType(&local_178,BLOB);
  Vector::Vector(&local_100,&local_178,iVar18);
  LogicalType::~LogicalType(&local_178);
  LogicalType::LogicalType(&local_190,BLOB);
  Vector::Vector(&local_98,&local_190,iVar19);
  LogicalType::~LogicalType(&local_190);
  CreateSortKeyHelpers::CreateSortKey(this_00,iVar18,(OrderModifiers)0x302,&local_100);
  CreateSortKeyHelpers::CreateSortKey(this_01,iVar19,(OrderModifiers)0x302,&local_98);
  local_1c8._M_buckets = &local_1c8._M_single_bucket;
  local_1c8._M_bucket_count = 1;
  local_1c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c8._M_element_count = 0;
  local_1c8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1c8._M_rehash_policy._M_next_resize = 0;
  local_1c8._M_single_bucket = (__node_base_ptr)0x0;
  VVar1 = vec->vector_type;
  VVar2 = vec_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar4 = result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      uVar28 = *(ulong *)((long)vec_00->data + 8);
      if (uVar28 == 0) {
        bVar14 = true;
      }
      else {
        uVar30 = *(ulong *)vec->data;
        uVar24 = *(ulong *)vec_00->data;
        uVar34 = *(ulong *)((long)vec->data + 8);
        ::std::
        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&local_1c8);
        if (uVar30 < uVar34 + uVar30) {
          do {
            uVar25 = uVar30;
            if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
              uVar25 = (ulong)(local_228.sel)->sel_vector[uVar30];
            }
            if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
              local_2b8.sel = (SelectionVector *)&local_1c8;
              ::std::
              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&local_1c8,local_100.data + uVar25 * 0x10,&local_2b8);
            }
            uVar30 = uVar30 + 1;
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
        }
        uVar30 = uVar28 + uVar24;
        bVar14 = uVar30 <= uVar24;
        if (uVar24 < uVar30) {
          bVar14 = false;
          do {
            uVar34 = uVar24;
            if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
              uVar34 = (ulong)(local_270.sel)->sel_vector[uVar24];
            }
            if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0)) &&
               (iVar20 = ::std::
                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(&local_1c8,(key_type *)(local_98.data + uVar34 * 0x10)),
               iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur == (__node_type *)0x0
               )) break;
            uVar24 = uVar24 + 1;
            bVar14 = uVar30 <= uVar24;
            uVar28 = uVar28 - 1;
          } while (uVar28 != 0);
        }
      }
      *pdVar4 = bVar14;
      goto LAB_01bd27a3;
    }
  }
  else {
    iVar18 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar4 = vec->data;
      puVar5 = (ulong *)vec_00->data;
      puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vec->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar18 != 0) {
            uVar30 = *puVar5;
            uVar24 = puVar5[1];
            uVar28 = uVar24 + uVar30;
            iVar19 = 0;
            do {
              if (uVar24 == 0) {
                bVar14 = true;
              }
              else {
                uVar34 = *(ulong *)(pdVar4 + iVar19 * 0x10);
                lVar31 = *(long *)(pdVar4 + iVar19 * 0x10 + 8);
                ::std::
                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::clear(&local_1c8);
                if (uVar34 < lVar31 + uVar34) {
                  do {
                    uVar25 = uVar34;
                    if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                      uVar25 = (ulong)(local_228.sel)->sel_vector[uVar34];
                    }
                    if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         == (unsigned_long *)0x0) ||
                       ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
                      local_2b8.sel = (SelectionVector *)&local_1c8;
                      ::std::
                      _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      ::
                      _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                  *)&local_1c8,local_100.data + uVar25 * 0x10,&local_2b8);
                    }
                    uVar34 = uVar34 + 1;
                    lVar31 = lVar31 + -1;
                  } while (lVar31 != 0);
                }
                bVar14 = uVar28 <= uVar30;
                if (uVar30 < uVar28) {
                  bVar14 = false;
                  uVar34 = uVar24;
                  uVar25 = uVar30;
                  do {
                    uVar29 = uVar25;
                    if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                      uVar29 = (ulong)(local_270.sel)->sel_vector[uVar25];
                    }
                    if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask == (unsigned_long *)0x0) ||
                        ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0)) &&
                       (iVar20 = ::std::
                                 _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 ::find(&local_1c8,(key_type *)(local_98.data + uVar29 * 0x10)),
                       iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                       (__node_type *)0x0)) break;
                    uVar25 = uVar25 + 1;
                    bVar14 = uVar28 <= uVar25;
                    uVar34 = uVar34 - 1;
                  } while (uVar34 != 0);
                }
              }
              pdVar6[iVar19] = bVar14;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar18);
          }
        }
        else {
          local_1e0 = iVar18 + 0x3f;
          if (0x3f < local_1e0) {
            local_1e0 = local_1e0 >> 6;
            uVar30 = 0;
            uVar28 = 0;
            do {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar27 = 0xffffffffffffffff;
              }
              else {
                uVar27 = puVar3[uVar30];
              }
              uVar24 = uVar28 + 0x40;
              if (iVar18 <= uVar28 + 0x40) {
                uVar24 = iVar18;
              }
              uVar34 = uVar24;
              local_1d8 = uVar30;
              if (uVar27 != 0) {
                uVar34 = uVar28;
                if (uVar27 == 0xffffffffffffffff) {
                  if (uVar28 < uVar24) {
                    uVar25 = *puVar5;
                    uVar29 = puVar5[1];
                    uVar30 = uVar29 + uVar25;
                    do {
                      if (uVar29 == 0) {
                        bVar14 = true;
                      }
                      else {
                        uVar34 = *(ulong *)(pdVar4 + uVar28 * 0x10);
                        lVar31 = *(long *)(pdVar4 + uVar28 * 0x10 + 8);
                        ::std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1c8);
                        if (uVar34 < uVar34 + lVar31) {
                          do {
                            uVar32 = uVar34;
                            if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                              uVar32 = (ulong)(local_228.sel)->sel_vector[uVar34];
                            }
                            if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask == (unsigned_long *)0x0) ||
                               ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) {
                              local_2b8.sel = (SelectionVector *)&local_1c8;
                              ::std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1c8,local_100.data + uVar32 * 0x10,&local_2b8);
                            }
                            uVar34 = uVar34 + 1;
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                        bVar14 = uVar30 <= uVar25;
                        if (uVar25 < uVar30) {
                          bVar14 = false;
                          uVar34 = uVar29;
                          uVar32 = uVar25;
                          do {
                            uVar26 = uVar32;
                            if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                              uVar26 = (ulong)(local_270.sel)->sel_vector[uVar32];
                            }
                            if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask == (unsigned_long *)0x0) ||
                                ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask[uVar26 >> 6] >> (uVar26 & 0x3f) & 1) != 0)) &&
                               (iVar20 = ::std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1c8,
                                                (key_type *)(local_98.data + uVar26 * 0x10)),
                               iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) break;
                            uVar32 = uVar32 + 1;
                            bVar14 = uVar30 <= uVar32;
                            uVar34 = uVar34 - 1;
                          } while (uVar34 != 0);
                        }
                      }
                      pdVar6[uVar28] = bVar14;
                      uVar28 = uVar28 + 1;
                      uVar34 = uVar28;
                    } while (uVar28 != uVar24);
                  }
                }
                else if (uVar28 < uVar24) {
                  do {
                    if ((uVar27 >> ((ulong)(uint)((int)uVar34 - (int)uVar28) & 0x3f) & 1) != 0) {
                      uVar30 = puVar5[1];
                      if (uVar30 == 0) {
                        bVar14 = true;
                      }
                      else {
                        uVar25 = *puVar5;
                        uVar29 = *(ulong *)(pdVar4 + uVar34 * 0x10);
                        lVar31 = *(long *)(pdVar4 + uVar34 * 0x10 + 8);
                        ::std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1c8);
                        if (uVar29 < uVar29 + lVar31) {
                          do {
                            uVar32 = uVar29;
                            if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                              uVar32 = (ulong)(local_228.sel)->sel_vector[uVar29];
                            }
                            if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask == (unsigned_long *)0x0) ||
                               ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) {
                              local_2b8.sel = (SelectionVector *)&local_1c8;
                              ::std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1c8,local_100.data + uVar32 * 0x10,&local_2b8);
                            }
                            uVar29 = uVar29 + 1;
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                        uVar29 = uVar30 + uVar25;
                        bVar14 = uVar29 <= uVar25;
                        if (uVar25 < uVar29) {
                          bVar14 = false;
                          do {
                            uVar32 = uVar25;
                            if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                              uVar32 = (ulong)(local_270.sel)->sel_vector[uVar25];
                            }
                            if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask == (unsigned_long *)0x0) ||
                                ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) &&
                               (iVar20 = ::std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1c8,
                                                (key_type *)(local_98.data + uVar32 * 0x10)),
                               iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) break;
                            uVar25 = uVar25 + 1;
                            bVar14 = uVar29 <= uVar25;
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                      }
                      pdVar6[uVar34] = bVar14;
                    }
                    uVar34 = uVar34 + 1;
                  } while (uVar34 != uVar24);
                }
              }
              uVar30 = local_1d8 + 1;
              uVar28 = uVar34;
            } while (uVar30 != local_1e0);
          }
        }
        goto LAB_01bd27a3;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar4 = vec->data;
          pdVar6 = vec_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar9 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vec);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vec->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vec_00);
          this_02 = &result->validity;
          ValidityMask::Combine(this_02,&vec_00->validity,iVar18);
          if ((this_02->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar18 != 0) {
              iVar19 = 0;
              do {
                lVar33 = iVar19 * 0x10;
                lVar31 = *(long *)(pdVar6 + lVar33 + 8);
                if (lVar31 == 0) {
                  bVar14 = true;
                }
                else {
                  uVar28 = *(ulong *)(pdVar6 + lVar33);
                  uVar30 = *(ulong *)(pdVar4 + lVar33);
                  lVar33 = *(long *)(pdVar4 + lVar33 + 8);
                  ::std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1c8);
                  if (uVar30 < uVar30 + lVar33) {
                    do {
                      uVar24 = uVar30;
                      if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                        uVar24 = (ulong)(local_228.sel)->sel_vector[uVar30];
                      }
                      if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask == (unsigned_long *)0x0) ||
                         ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) {
                        local_2b8.sel = (SelectionVector *)&local_1c8;
                        ::std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1c8,local_100.data + uVar24 * 0x10,&local_2b8);
                      }
                      uVar30 = uVar30 + 1;
                      lVar33 = lVar33 + -1;
                    } while (lVar33 != 0);
                  }
                  uVar30 = lVar31 + uVar28;
                  bVar14 = uVar30 <= uVar28;
                  if (uVar28 < uVar30) {
                    bVar14 = false;
                    do {
                      uVar24 = uVar28;
                      if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                        uVar24 = (ulong)(local_270.sel)->sel_vector[uVar28];
                      }
                      if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask == (unsigned_long *)0x0) ||
                          ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) &&
                         (iVar20 = ::std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_1c8,(key_type *)(local_98.data + uVar24 * 0x10)),
                         iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                         (__node_type *)0x0)) break;
                      uVar28 = uVar28 + 1;
                      bVar14 = uVar30 <= uVar28;
                      lVar31 = lVar31 + -1;
                    } while (lVar31 != 0);
                  }
                }
                pdVar9[iVar19] = bVar14;
                iVar19 = iVar19 + 1;
              } while (iVar19 != iVar18);
            }
          }
          else if (0x3f < iVar18 + 0x3f) {
            uVar28 = 0;
            local_2e8 = 0;
            do {
              puVar3 = (this_02->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar27 = 0xffffffffffffffff;
              }
              else {
                uVar27 = puVar3[local_2e8];
              }
              uVar30 = uVar28 + 0x40;
              if (iVar18 <= uVar28 + 0x40) {
                uVar30 = iVar18;
              }
              uVar24 = uVar30;
              if (uVar27 != 0) {
                uVar24 = uVar28;
                if (uVar27 == 0xffffffffffffffff) {
                  if (uVar28 < uVar30) {
                    do {
                      lVar33 = uVar28 * 0x10;
                      lVar31 = *(long *)(pdVar6 + lVar33 + 8);
                      if (lVar31 == 0) {
                        bVar14 = true;
                      }
                      else {
                        uVar24 = *(ulong *)(pdVar6 + lVar33);
                        uVar34 = *(ulong *)(pdVar4 + lVar33);
                        lVar33 = *(long *)(pdVar4 + lVar33 + 8);
                        ::std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1c8);
                        if (uVar34 < uVar34 + lVar33) {
                          do {
                            uVar25 = uVar34;
                            if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                              uVar25 = (ulong)(local_228.sel)->sel_vector[uVar34];
                            }
                            if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask == (unsigned_long *)0x0) ||
                               ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
                              local_2b8.sel = (SelectionVector *)&local_1c8;
                              ::std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1c8,local_100.data + uVar25 * 0x10,&local_2b8);
                            }
                            uVar34 = uVar34 + 1;
                            lVar33 = lVar33 + -1;
                          } while (lVar33 != 0);
                        }
                        uVar34 = uVar24 + lVar31;
                        bVar14 = uVar34 <= uVar24;
                        if (uVar24 < uVar34) {
                          bVar14 = false;
                          do {
                            uVar25 = uVar24;
                            if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                              uVar25 = (ulong)(local_270.sel)->sel_vector[uVar24];
                            }
                            if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask == (unsigned_long *)0x0) ||
                                ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) &&
                               (iVar20 = ::std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1c8,
                                                (key_type *)(local_98.data + uVar25 * 0x10)),
                               iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) break;
                            uVar24 = uVar24 + 1;
                            bVar14 = uVar34 <= uVar24;
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                      }
                      pdVar9[uVar28] = bVar14;
                      uVar28 = uVar28 + 1;
                      uVar24 = uVar28;
                    } while (uVar28 != uVar30);
                  }
                }
                else if (uVar28 < uVar30) {
                  do {
                    if ((uVar27 >> ((ulong)(uint)((int)uVar24 - (int)uVar28) & 0x3f) & 1) != 0) {
                      lVar33 = uVar24 * 0x10;
                      lVar31 = *(long *)(pdVar6 + lVar33 + 8);
                      if (lVar31 == 0) {
                        bVar14 = true;
                      }
                      else {
                        uVar34 = *(ulong *)(pdVar6 + lVar33);
                        uVar25 = *(ulong *)(pdVar4 + lVar33);
                        lVar33 = *(long *)(pdVar4 + lVar33 + 8);
                        ::std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1c8);
                        if (uVar25 < uVar25 + lVar33) {
                          do {
                            uVar29 = uVar25;
                            if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                              uVar29 = (ulong)(local_228.sel)->sel_vector[uVar25];
                            }
                            if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask == (unsigned_long *)0x0) ||
                               ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0)) {
                              local_2b8.sel = (SelectionVector *)&local_1c8;
                              ::std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1c8,local_100.data + uVar29 * 0x10,&local_2b8);
                            }
                            uVar25 = uVar25 + 1;
                            lVar33 = lVar33 + -1;
                          } while (lVar33 != 0);
                        }
                        uVar25 = lVar31 + uVar34;
                        bVar14 = uVar25 <= uVar34;
                        if (uVar34 < uVar25) {
                          bVar14 = false;
                          do {
                            uVar29 = uVar34;
                            if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                              uVar29 = (ulong)(local_270.sel)->sel_vector[uVar34];
                            }
                            if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask == (unsigned_long *)0x0) ||
                                ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0)) &&
                               (iVar20 = ::std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1c8,
                                                (key_type *)(local_98.data + uVar29 * 0x10)),
                               iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) break;
                            uVar34 = uVar34 + 1;
                            bVar14 = uVar25 <= uVar34;
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                      }
                      pdVar9[uVar24] = bVar14;
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar30);
                }
              }
              uVar28 = uVar24;
              local_2e8 = local_2e8 + 1;
            } while (local_2e8 != iVar18 + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_2b8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_148);
          Vector::ToUnifiedFormat(vec,iVar18,&local_2b8);
          Vector::ToUnifiedFormat(vec_00,iVar18,&local_148);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pSVar13 = local_2b8.sel;
          pdVar4 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_2b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar18 != 0) {
              pp_Var7 = (__buckets_ptr)pSVar13->sel_vector;
              psVar8 = (local_148.sel)->sel_vector;
              iVar19 = 0;
              do {
                iVar21 = iVar19;
                if (pp_Var7 != (__buckets_ptr)0x0) {
                  iVar21 = (idx_t)*(uint *)((long)pp_Var7 + iVar19 * 4);
                }
                iVar23 = iVar19;
                if (psVar8 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar8[iVar19];
                }
                lVar31 = *(long *)(local_148.data + iVar23 * 0x10 + 8);
                if (lVar31 == 0) {
                  bVar14 = true;
                }
                else {
                  uVar28 = *(ulong *)(local_2b8.data + iVar21 * 0x10);
                  lVar33 = *(long *)(local_2b8.data + iVar21 * 0x10 + 8);
                  uVar30 = *(ulong *)(local_148.data + iVar23 * 0x10);
                  ::std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1c8);
                  if (uVar28 < uVar28 + lVar33) {
                    do {
                      uVar24 = uVar28;
                      if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                        uVar24 = (ulong)(local_228.sel)->sel_vector[uVar28];
                      }
                      if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask == (unsigned_long *)0x0) ||
                         ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) {
                        local_2c8 = &local_1c8;
                        ::std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1c8,local_100.data + uVar24 * 0x10,&local_2c8);
                      }
                      uVar28 = uVar28 + 1;
                      lVar33 = lVar33 + -1;
                    } while (lVar33 != 0);
                  }
                  uVar28 = lVar31 + uVar30;
                  bVar14 = uVar28 <= uVar30;
                  if (uVar30 < uVar28) {
                    bVar14 = false;
                    do {
                      uVar24 = uVar30;
                      if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                        uVar24 = (ulong)(local_270.sel)->sel_vector[uVar30];
                      }
                      if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask == (unsigned_long *)0x0) ||
                          ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) &&
                         (iVar20 = ::std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_1c8,(key_type *)(local_98.data + uVar24 * 0x10)),
                         iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                         (__node_type *)0x0)) break;
                      uVar30 = uVar30 + 1;
                      bVar14 = uVar28 <= uVar30;
                      lVar31 = lVar31 + -1;
                    } while (lVar31 != 0);
                  }
                }
                pdVar4[iVar19] = bVar14;
                iVar19 = iVar19 + 1;
              } while (iVar19 != iVar18);
            }
          }
          else if (iVar18 != 0) {
            pp_Var7 = (__buckets_ptr)pSVar13->sel_vector;
            psVar8 = (local_148.sel)->sel_vector;
            uVar28 = 0;
            do {
              uVar30 = uVar28;
              if (pp_Var7 != (__buckets_ptr)0x0) {
                uVar30 = (ulong)*(uint *)((long)pp_Var7 + uVar28 * 4);
              }
              uVar24 = uVar28;
              if (psVar8 != (sel_t *)0x0) {
                uVar24 = (ulong)psVar8[uVar28];
              }
              if (((local_2b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_2b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) &&
                 ((local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)))) {
                lVar31 = *(long *)(local_148.data + uVar24 * 0x10 + 8);
                if (lVar31 == 0) {
                  bVar14 = true;
                }
                else {
                  uVar24 = *(ulong *)(local_148.data + uVar24 * 0x10);
                  uVar34 = *(ulong *)(local_2b8.data + uVar30 * 0x10);
                  lVar33 = *(long *)(local_2b8.data + uVar30 * 0x10 + 8);
                  ::std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1c8);
                  if (uVar34 < uVar34 + lVar33) {
                    do {
                      uVar30 = uVar34;
                      if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                        uVar30 = (ulong)(local_228.sel)->sel_vector[uVar34];
                      }
                      if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask == (unsigned_long *)0x0) ||
                         ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask[uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) {
                        local_2c8 = &local_1c8;
                        ::std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1c8,local_100.data + uVar30 * 0x10,&local_2c8);
                      }
                      uVar34 = uVar34 + 1;
                      lVar33 = lVar33 + -1;
                    } while (lVar33 != 0);
                  }
                  uVar30 = uVar24 + lVar31;
                  bVar14 = uVar30 <= uVar24;
                  if (uVar24 < uVar30) {
                    bVar14 = false;
                    do {
                      uVar34 = uVar24;
                      if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                        uVar34 = (ulong)(local_270.sel)->sel_vector[uVar24];
                      }
                      if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask == (unsigned_long *)0x0) ||
                          ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0)) &&
                         (iVar20 = ::std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_1c8,(key_type *)(local_98.data + uVar34 * 0x10)),
                         iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                         (__node_type *)0x0)) break;
                      uVar24 = uVar24 + 1;
                      bVar14 = uVar30 <= uVar24;
                      lVar31 = lVar31 + -1;
                    } while (lVar31 != 0);
                  }
                }
                pdVar4[uVar28] = bVar14;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_1d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_2c8,&local_1d0);
                  p_Var12 = p_Stack_2c0;
                  p_Var11 = local_2c8;
                  local_2c8 = (_Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)0x0;
                  p_Stack_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)p_Var11;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var12;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2c0);
                  }
                  pTVar22 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar22->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar10 = (byte)uVar28 & 0x3f;
                puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (uVar28 >> 6);
                *puVar5 = *puVar5 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != iVar18);
          }
          if (local_148.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_2b8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_2b8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_2b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_2b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        goto LAB_01bd27a3;
      }
      puVar5 = (ulong *)vec->data;
      puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = vec_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar18 != 0) {
            uVar28 = *puVar5;
            iVar19 = 0;
            do {
              lVar31 = *(long *)(pdVar4 + iVar19 * 0x10 + 8);
              if (lVar31 == 0) {
                bVar14 = true;
              }
              else {
                uVar30 = *(ulong *)(pdVar4 + iVar19 * 0x10);
                uVar24 = puVar5[1];
                ::std::
                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::clear(&local_1c8);
                uVar34 = uVar28;
                if (uVar28 < uVar24 + uVar28) {
                  do {
                    uVar25 = uVar34;
                    if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                      uVar25 = (ulong)(local_228.sel)->sel_vector[uVar34];
                    }
                    if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         == (unsigned_long *)0x0) ||
                       ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                         [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
                      local_2b8.sel = (SelectionVector *)&local_1c8;
                      ::std::
                      _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      ::
                      _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                  *)&local_1c8,local_100.data + uVar25 * 0x10,&local_2b8);
                    }
                    uVar34 = uVar34 + 1;
                    uVar24 = uVar24 - 1;
                  } while (uVar24 != 0);
                }
                uVar24 = uVar30 + lVar31;
                bVar14 = uVar24 <= uVar30;
                if (uVar30 < uVar24) {
                  bVar14 = false;
                  do {
                    uVar34 = uVar30;
                    if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                      uVar34 = (ulong)(local_270.sel)->sel_vector[uVar30];
                    }
                    if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask == (unsigned_long *)0x0) ||
                        ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[uVar34 >> 6] >> (uVar34 & 0x3f) & 1) != 0)) &&
                       (iVar20 = ::std::
                                 _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 ::find(&local_1c8,(key_type *)(local_98.data + uVar34 * 0x10)),
                       iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                       (__node_type *)0x0)) break;
                    uVar30 = uVar30 + 1;
                    bVar14 = uVar24 <= uVar30;
                    lVar31 = lVar31 + -1;
                  } while (lVar31 != 0);
                }
              }
              pdVar6[iVar19] = bVar14;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar18);
          }
        }
        else if (0x3f < iVar18 + 0x3f) {
          uVar28 = 0;
          local_2e8 = 0;
          do {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar27 = 0xffffffffffffffff;
            }
            else {
              uVar27 = puVar3[local_2e8];
            }
            uVar30 = uVar28 + 0x40;
            if (iVar18 <= uVar28 + 0x40) {
              uVar30 = iVar18;
            }
            uVar24 = uVar30;
            if (uVar27 != 0) {
              uVar24 = uVar28;
              if (uVar27 == 0xffffffffffffffff) {
                if (uVar28 < uVar30) {
                  uVar34 = *puVar5;
                  do {
                    lVar31 = *(long *)(pdVar4 + uVar28 * 0x10 + 8);
                    if (lVar31 == 0) {
                      bVar14 = true;
                    }
                    else {
                      uVar24 = *(ulong *)(pdVar4 + uVar28 * 0x10);
                      uVar25 = puVar5[1];
                      ::std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_1c8);
                      uVar29 = uVar34;
                      if (uVar34 < uVar25 + uVar34) {
                        do {
                          uVar32 = uVar29;
                          if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                            uVar32 = (ulong)(local_228.sel)->sel_vector[uVar29];
                          }
                          if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask == (unsigned_long *)0x0) ||
                             ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) {
                            local_2b8.sel = (SelectionVector *)&local_1c8;
                            ::std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)&local_1c8,local_100.data + uVar32 * 0x10,&local_2b8);
                          }
                          uVar29 = uVar29 + 1;
                          uVar25 = uVar25 - 1;
                        } while (uVar25 != 0);
                      }
                      uVar25 = uVar24 + lVar31;
                      bVar14 = uVar25 <= uVar24;
                      if (uVar24 < uVar25) {
                        bVar14 = false;
                        do {
                          uVar29 = uVar24;
                          if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                            uVar29 = (ulong)(local_270.sel)->sel_vector[uVar24];
                          }
                          if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                validity_mask == (unsigned_long *)0x0) ||
                              ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                validity_mask[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0)) &&
                             (iVar20 = ::std::
                                       _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                       ::find(&local_1c8,(key_type *)(local_98.data + uVar29 * 0x10)
                                             ),
                             iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                             (__node_type *)0x0)) break;
                          uVar24 = uVar24 + 1;
                          bVar14 = uVar25 <= uVar24;
                          lVar31 = lVar31 + -1;
                        } while (lVar31 != 0);
                      }
                    }
                    pdVar6[uVar28] = bVar14;
                    uVar28 = uVar28 + 1;
                    uVar24 = uVar28;
                  } while (uVar28 != uVar30);
                }
              }
              else if (uVar28 < uVar30) {
                do {
                  if ((uVar27 >> ((ulong)(uint)((int)uVar24 - (int)uVar28) & 0x3f) & 1) != 0) {
                    lVar31 = *(long *)(pdVar4 + uVar24 * 0x10 + 8);
                    if (lVar31 == 0) {
                      bVar14 = true;
                    }
                    else {
                      uVar34 = *(ulong *)(pdVar4 + uVar24 * 0x10);
                      uVar25 = *puVar5;
                      uVar29 = puVar5[1];
                      ::std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_1c8);
                      if (uVar25 < uVar25 + uVar29) {
                        do {
                          uVar32 = uVar25;
                          if ((local_228.sel)->sel_vector != (sel_t *)0x0) {
                            uVar32 = (ulong)(local_228.sel)->sel_vector[uVar25];
                          }
                          if ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask == (unsigned_long *)0x0) ||
                             ((local_228.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0)) {
                            local_2b8.sel = (SelectionVector *)&local_1c8;
                            ::std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)&local_1c8,local_100.data + uVar32 * 0x10,&local_2b8);
                          }
                          uVar25 = uVar25 + 1;
                          uVar29 = uVar29 - 1;
                        } while (uVar29 != 0);
                      }
                      uVar25 = lVar31 + uVar34;
                      bVar14 = uVar25 <= uVar34;
                      if (uVar34 < uVar25) {
                        bVar14 = false;
                        do {
                          uVar29 = uVar34;
                          if ((local_270.sel)->sel_vector != (sel_t *)0x0) {
                            uVar29 = (ulong)(local_270.sel)->sel_vector[uVar34];
                          }
                          if (((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                validity_mask == (unsigned_long *)0x0) ||
                              ((local_270.validity.super_TemplatedValidityMask<unsigned_long>.
                                validity_mask[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0)) &&
                             (iVar20 = ::std::
                                       _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                       ::find(&local_1c8,(key_type *)(local_98.data + uVar29 * 0x10)
                                             ),
                             iVar20.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                             (__node_type *)0x0)) break;
                          uVar34 = uVar34 + 1;
                          bVar14 = uVar25 <= uVar34;
                          lVar31 = lVar31 + -1;
                        } while (lVar31 != 0);
                      }
                    }
                    pdVar6[uVar24] = bVar14;
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar30);
              }
            }
            uVar28 = uVar24;
            local_2e8 = local_2e8 + 1;
          } while (local_2e8 != iVar18 + 0x3f >> 6);
        }
        goto LAB_01bd27a3;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01bd27a3:
  ::std::
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1c8);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_100.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_100.type);
  if (local_270.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_270.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_228.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_228.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListHasAllFunction(DataChunk &args, ExpressionState &state, Vector &result) {

	const auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto swap = func_expr.function.name == "<@";

	auto &l_vec = args.data[swap ? 1 : 0];
	auto &r_vec = args.data[swap ? 0 : 1];

	if (ListType::GetChildType(l_vec.GetType()) == LogicalType::SQLNULL &&
	    ListType::GetChildType(r_vec.GetType()) == LogicalType::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<bool>(result)[0] = true;
		return;
	}

	const auto l_size = ListVector::GetListSize(l_vec);
	const auto r_size = ListVector::GetListSize(r_vec);

	auto &l_child = ListVector::GetEntry(l_vec);
	auto &r_child = ListVector::GetEntry(r_vec);

	// Setup unified formats for the list elements
	UnifiedVectorFormat build_format;
	UnifiedVectorFormat probe_format;

	l_child.ToUnifiedFormat(l_size, build_format);
	r_child.ToUnifiedFormat(r_size, probe_format);

	// Create the sort keys for the list elements
	Vector l_sortkey_vec(LogicalType::BLOB, l_size);
	Vector r_sortkey_vec(LogicalType::BLOB, r_size);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);

	CreateSortKeyHelpers::CreateSortKey(l_child, l_size, order_modifiers, l_sortkey_vec);
	CreateSortKeyHelpers::CreateSortKey(r_child, r_size, order_modifiers, r_sortkey_vec);

	const auto build_data = FlatVector::GetData<string_t>(l_sortkey_vec);
	const auto probe_data = FlatVector::GetData<string_t>(r_sortkey_vec);

	string_set_t set;

	BinaryExecutor::Execute<list_entry_t, list_entry_t, bool>(
	    l_vec, r_vec, result, args.size(), [&](const list_entry_t &build_list, const list_entry_t &probe_list) {
		    // Short circuit if the probe list is empty
		    if (probe_list.length == 0) {
			    return true;
		    }

		    // Reset the set
		    set.clear();

		    // Build the set
		    for (auto idx = build_list.offset; idx < build_list.offset + build_list.length; idx++) {
			    const auto entry_idx = build_format.sel->get_index(idx);
			    if (build_format.validity.RowIsValid(entry_idx)) {
				    set.insert(build_data[entry_idx]);
			    }
		    }

		    // Probe the set
		    for (auto idx = probe_list.offset; idx < probe_list.offset + probe_list.length; idx++) {
			    const auto entry_idx = probe_format.sel->get_index(idx);
			    if (probe_format.validity.RowIsValid(entry_idx) && set.find(probe_data[entry_idx]) == set.end()) {
				    return false;
			    }
		    }
		    return true;
	    });
}